

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_token(vector<Token,_std::allocator<Token>_> *v)

{
  vector<Token,_std::allocator<Token>_> *this;
  bool bVar1;
  ostream *this_00;
  string local_270;
  reference local_250;
  Token *it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Token,_std::allocator<Token>_> *__range1;
  char local_220 [8];
  fstream f;
  ostream local_210 [512];
  vector<Token,_std::allocator<Token>_> *local_10;
  vector<Token,_std::allocator<Token>_> *v_local;
  
  local_10 = v;
  std::fstream::fstream(local_220);
  std::fstream::open(local_220,0x125030);
  this = local_10;
  __end1 = std::vector<Token,_std::allocator<Token>_>::begin(local_10);
  it = (Token *)std::vector<Token,_std::allocator<Token>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_>
                                *)&it);
    if (!bVar1) break;
    local_250 = __gnu_cxx::
                __normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_>::
                operator*(&__end1);
    Token::to_string_abi_cxx11_(&local_270,local_250);
    this_00 = std::operator<<(local_210,(string *)&local_270);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_270);
    __gnu_cxx::__normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_>::
    operator++(&__end1);
  }
  std::fstream::close();
  std::fstream::~fstream(local_220);
  return;
}

Assistant:

void print_token(const vector<Token> &v) {
    fstream f;
    f.open("token.txt", ios::out);
    for (const auto &it : v) {
        f << it.to_string() << endl;
    }
    f.close();
}